

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomialfit.cpp
# Opt level: O1

bool __thiscall PolynomialFit::process(PolynomialFit *this)

{
  int iVar1;
  fraction *pfVar2;
  bool bVar3;
  long lVar4;
  AugmentedMatrix am;
  AugmentedMatrix AStack_328;
  
  bVar3 = leastQuare(this);
  if (bVar3) {
    AugmentedMatrix::AugmentedMatrix(&AStack_328);
    AugmentedMatrix::setMatrixData(&AStack_328,this->matrix,this->multiterm,this->multiterm);
    AugmentedMatrix::setAugmentData(&AStack_328,this->rvector,this->multiterm);
    bVar3 = AugmentedMatrix::process(&AStack_328);
    if ((bVar3) && (iVar1 = this->multiterm, 0 < (long)iVar1)) {
      pfVar2 = this->results;
      lVar4 = 0;
      do {
        *(unkbyte10 *)((long)pfVar2 + lVar4) = *(unkbyte10 *)((long)AStack_328.augment + lVar4);
        lVar4 = lVar4 + 0x10;
      } while ((long)iVar1 * 0x10 != lVar4);
    }
    AugmentedMatrix::~AugmentedMatrix(&AStack_328);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool PolynomialFit::process()
{
    // ������С���˷���һ�η�����
    if(!leastQuare())
        return false;

    // ͨ����˹���ⷽ����
    AugmentedMatrix am;
    am.setMatrixData( matrix , multiterm , multiterm ) ;
    am.setAugmentData( rvector , multiterm);
    if( !am.process() )
        return false;

    // �����Ľ������Ƕ���ʽ��ϵ��
    for(int i=0;i<multiterm;i++){
        results[i] = am.getResult(i);
    }

    return true;
}